

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O0

Vec_Ptr_t * Bac_NtkTransformToPtrBox(Bac_Ntk_t *p,int iBox)

{
  Mio_Library_t *pLib_00;
  int iVar1;
  int iVar2;
  Bac_Ntk_t *p_00;
  char *pcVar3;
  Vec_Ptr_t *p_01;
  bool bVar4;
  char *local_a0;
  char *local_78;
  Mio_Gate_t *local_48;
  Vec_Ptr_t *vBox;
  Mio_Gate_t *pGate;
  Mio_Library_t *pLib;
  Bac_Ntk_t *pBoxNtk;
  int fUser;
  int iTerm;
  int i;
  int iBox_local;
  Bac_Ntk_t *p_local;
  
  iVar1 = Bac_ObjIsBoxUser(p,iBox);
  p_00 = Bac_BoxNtk(p,iBox);
  pLib_00 = (Mio_Library_t *)p->pDesign->pMioLib;
  if (pLib_00 == (Mio_Library_t *)0x0) {
    local_48 = (Mio_Gate_t *)0x0;
  }
  else {
    pcVar3 = Bac_BoxNtkName(p,iBox);
    local_48 = Mio_LibraryReadGateByName(pLib_00,pcVar3,(char *)0x0);
  }
  iVar2 = Bac_BoxSize(p,iBox);
  p_01 = Vec_PtrAllocExact(iVar2 << 1);
  pcVar3 = Bac_BoxNtkName(p,iBox);
  Vec_PtrPush(p_01,pcVar3);
  pcVar3 = Bac_ObjNameStr(p,iBox);
  Vec_PtrPush(p_01,pcVar3);
  pBoxNtk._4_4_ = iBox + -1;
  fUser = 0;
  while( true ) {
    bVar4 = false;
    if (-1 < pBoxNtk._4_4_) {
      iVar2 = Bac_ObjIsBi(p,pBoxNtk._4_4_);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    if (iVar1 == 0) {
      local_78 = Mio_GateReadPinName(local_48,fUser);
    }
    else {
      iVar2 = Bac_NtkPi(p_00,fUser);
      local_78 = Bac_ObjNameStr(p_00,iVar2);
    }
    Vec_PtrPush(p_01,local_78);
    pcVar3 = Bac_ObjNameStr(p,pBoxNtk._4_4_);
    Vec_PtrPush(p_01,pcVar3);
    pBoxNtk._4_4_ = pBoxNtk._4_4_ + -1;
    fUser = fUser + 1;
  }
  pBoxNtk._4_4_ = iBox + 1;
  fUser = 0;
  while( true ) {
    iVar2 = Bac_NtkObjNum(p);
    bVar4 = false;
    if (pBoxNtk._4_4_ < iVar2) {
      iVar2 = Bac_ObjIsBo(p,pBoxNtk._4_4_);
      bVar4 = iVar2 != 0;
    }
    if (!bVar4) break;
    if (iVar1 == 0) {
      local_a0 = Mio_GateReadOutName(local_48);
    }
    else {
      iVar2 = Bac_NtkPo(p_00,fUser);
      local_a0 = Bac_ObjNameStr(p_00,iVar2);
    }
    Vec_PtrPush(p_01,local_a0);
    pcVar3 = Bac_ObjNameStr(p,pBoxNtk._4_4_);
    Vec_PtrPush(p_01,pcVar3);
    pBoxNtk._4_4_ = pBoxNtk._4_4_ + 1;
    fUser = fUser + 1;
  }
  iVar1 = Ptr_CheckArray(p_01);
  if (iVar1 != 0) {
    return p_01;
  }
  __assert_fail("Ptr_CheckArray(vBox)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/bac/bacPtrAbc.c"
                ,0x1a1,"Vec_Ptr_t *Bac_NtkTransformToPtrBox(Bac_Ntk_t *, int)");
}

Assistant:

Vec_Ptr_t * Bac_NtkTransformToPtrBox( Bac_Ntk_t * p, int iBox )
{
    int i, iTerm, fUser = Bac_ObjIsBoxUser( p, iBox );
    Bac_Ntk_t * pBoxNtk = Bac_BoxNtk( p, iBox );
    Mio_Library_t * pLib = (Mio_Library_t *)p->pDesign->pMioLib;
    Mio_Gate_t * pGate = pLib ? Mio_LibraryReadGateByName( pLib, Bac_BoxNtkName(p, iBox), NULL ) : NULL;
    Vec_Ptr_t * vBox = Vec_PtrAllocExact( 2*Bac_BoxSize(p, iBox) );
    Vec_PtrPush( vBox, Bac_BoxNtkName(p, iBox) );
    Vec_PtrPush( vBox, Bac_ObjNameStr(p, iBox) );
    Bac_BoxForEachBi( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPi(pBoxNtk, i)) : Mio_GateReadPinName(pGate, i) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    Bac_BoxForEachBo( p, iBox, iTerm, i )
    {
        Vec_PtrPush( vBox, fUser ? Bac_ObjNameStr(pBoxNtk, Bac_NtkPo(pBoxNtk, i)) : Mio_GateReadOutName(pGate) );
        Vec_PtrPush( vBox, Bac_ObjNameStr(p, iTerm) );
    }
    assert( Ptr_CheckArray(vBox) );
    return vBox;
}